

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.h
# Opt level: O3

void __thiscall
wavingz::demod::state_machine::symbol_sm_t::symbol_sm_t
          (symbol_sm_t *this,function<void_(unsigned_char_*,_unsigned_char_*)> *callback)

{
  state_base_t *psVar1;
  
  std::function<void_(unsigned_char_*,_unsigned_char_*)>::function(&this->callback,callback);
  psVar1 = (state_base_t *)operator_new(0x10);
  psVar1->_vptr_state_base_t = (_func_int **)&PTR_process_00113c28;
  psVar1[1]._vptr_state_base_t = (_func_int **)0x0;
  (this->current_state_m)._M_t.
  super___uniq_ptr_impl<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  .super__Head_base<0UL,_wavingz::demod::state_machine::symbol_sm::state_base_t_*,_false>.
  _M_head_impl = psVar1;
  return;
}

Assistant:

symbol_sm_t(const std::function<void(uint8_t*, uint8_t*)>& callback)
      : callback(callback)
      , current_state_m(new symbol_sm::start_of_frame_1_t())
    {
    }